

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_main.c
# Opt level: O2

void assert_version_id(char **qq,size_t *ss)

{
  char *pcVar1;
  size_t sVar2;
  char cVar3;
  undefined8 in_RCX;
  undefined7 uVar4;
  long lVar5;
  ulong uVar6;
  char *pcVar7;
  int iVar8;
  void *in_R8;
  bool bVar9;
  
  pcVar1 = *qq;
  sVar2 = *ss;
  pcVar7 = pcVar1 + sVar2;
  lVar5 = 0;
  do {
    uVar6 = sVar2 - lVar5;
    uVar4 = (undefined7)((ulong)in_RCX >> 8);
    if (uVar6 == 0) {
      in_RCX = CONCAT71(uVar4,*pcVar7);
LAB_00103870:
      cVar3 = (char)in_RCX;
      if (cVar3 == 'd') {
        cVar3 = 'd';
        if ((pcVar7[1] == 'e') && (pcVar7[2] == 'v')) {
          uVar6 = (sVar2 - lVar5) - 3;
          cVar3 = pcVar7[3];
          pcVar7 = pcVar7 + 3;
        }
      }
      pcVar7 = pcVar7 + ((byte)(cVar3 + 0x9fU) < 4);
      failure("No space after version: ``%s\'\'",pcVar7);
      assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/test_utils/test_main.c"
                       ,L'ॕ',(uint)(1 < uVar6),"s > 1",in_R8);
      failure("No space after version: ``%s\'\'",pcVar7);
      assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/test_utils/test_main.c"
                       ,L'ॗ',(uint)(*pcVar7 == ' '),"*q == \' \'",in_R8);
      *qq = pcVar7 + 1;
      *ss = uVar6 - 1;
      return;
    }
    in_RCX = CONCAT71(uVar4,pcVar1[lVar5]);
    iVar8 = (int)in_RCX + -0x30;
    bVar9 = 9 < (byte)iVar8;
    in_R8 = (void *)(ulong)CONCAT31((int3)((uint)iVar8 >> 8),bVar9);
    if (pcVar1[lVar5] != '.' && bVar9) {
      pcVar7 = pcVar1 + lVar5;
      goto LAB_00103870;
    }
    lVar5 = lVar5 + 1;
  } while( true );
}

Assistant:

static void assert_version_id(char **qq, size_t *ss)
{
	char *q = *qq;
	size_t s = *ss;

	/* Version number is a series of digits and periods. */
	while (s > 0 && (*q == '.' || (*q >= '0' && *q <= '9'))) {
		++q;
		--s;
	}

	if (q[0] == 'd' && q[1] == 'e' && q[2] == 'v') {
		q += 3;
		s -= 3;
	}

	/* Skip a single trailing a,b,c, or d. */
	if (*q == 'a' || *q == 'b' || *q == 'c' || *q == 'd')
		++q;

	/* Version number terminated by space. */
	failure("No space after version: ``%s''", q);
	assert(s > 1);
	failure("No space after version: ``%s''", q);
	assert(*q == ' ');

	++q; --s;

	*qq = q;
	*ss = s;
}